

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfMatrixAttribute.cpp
# Opt level: O2

void __thiscall
Imf_2_5::TypedAttribute<Imath_2_5::Matrix33<float>_>::readValueFrom
          (TypedAttribute<Imath_2_5::Matrix33<float>_> *this,IStream *is,int size,int version)

{
  Xdr::read<Imf_2_5::StreamIO,Imf_2_5::IStream>(is,(float *)&this->_value);
  Xdr::read<Imf_2_5::StreamIO,Imf_2_5::IStream>(is,(this->_value).x[0] + 1);
  Xdr::read<Imf_2_5::StreamIO,Imf_2_5::IStream>(is,(this->_value).x[0] + 2);
  Xdr::read<Imf_2_5::StreamIO,Imf_2_5::IStream>(is,(this->_value).x[1]);
  Xdr::read<Imf_2_5::StreamIO,Imf_2_5::IStream>(is,(this->_value).x[1] + 1);
  Xdr::read<Imf_2_5::StreamIO,Imf_2_5::IStream>(is,(this->_value).x[1] + 2);
  Xdr::read<Imf_2_5::StreamIO,Imf_2_5::IStream>(is,(this->_value).x[2]);
  Xdr::read<Imf_2_5::StreamIO,Imf_2_5::IStream>(is,(this->_value).x[2] + 1);
  Xdr::read<Imf_2_5::StreamIO,Imf_2_5::IStream>(is,(this->_value).x[2] + 2);
  return;
}

Assistant:

void
M33fAttribute::readValueFrom (OPENEXR_IMF_INTERNAL_NAMESPACE::IStream &is, int size, int version)
{
    Xdr::read <StreamIO> (is, _value[0][0]);
    Xdr::read <StreamIO> (is, _value[0][1]);
    Xdr::read <StreamIO> (is, _value[0][2]);

    Xdr::read <StreamIO> (is, _value[1][0]);
    Xdr::read <StreamIO> (is, _value[1][1]);
    Xdr::read <StreamIO> (is, _value[1][2]);

    Xdr::read <StreamIO> (is, _value[2][0]);
    Xdr::read <StreamIO> (is, _value[2][1]);
    Xdr::read <StreamIO> (is, _value[2][2]);
}